

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpLexer.cpp
# Opt level: O1

void __thiscall GrpLexer::mOP_LE(GrpLexer *this,bool _createToken)

{
  Token *pTVar1;
  Token *pTVar2;
  RefToken _token;
  RefCount<Token> local_58;
  RefCount<Token> local_50 [2];
  Ref local_40;
  
  local_58.ref = (Ref *)0x0;
  local_50[0].ref = &local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"<=","");
  (*(this->super_CharScanner).super_TokenStream._vptr_TokenStream[0x17])(this,local_50);
  if (local_50[0].ref != &local_40) {
    operator_delete(local_50[0].ref,(ulong)((long)&(local_40.ptr)->_vptr_Token + 1));
  }
  if (_createToken) {
    if (local_58.ref == (Ref *)0x0) {
      pTVar1 = (Token *)0x0;
    }
    else {
      pTVar1 = (local_58.ref)->ptr;
    }
    if (nullToken.ref == (Ref *)0x0) {
      pTVar2 = (Token *)0x0;
    }
    else {
      pTVar2 = (nullToken.ref)->ptr;
    }
    if (pTVar1 == pTVar2) {
      (*(this->super_CharScanner).super_TokenStream._vptr_TokenStream[0x13])(local_50,this,0x49);
      RefCount<Token>::operator=(&local_58,local_50);
      RefCount<Token>::~RefCount(local_50);
      if (local_58.ref == (Ref *)0x0) {
        pTVar1 = (Token *)0x0;
      }
      else {
        pTVar1 = (local_58.ref)->ptr;
      }
      std::__cxx11::string::substr((ulong)local_50,(ulong)&(this->super_CharScanner).text);
      (*pTVar1->_vptr_Token[6])(pTVar1,local_50);
      if (local_50[0].ref != &local_40) {
        operator_delete(local_50[0].ref,(ulong)((long)&(local_40.ptr)->_vptr_Token + 1));
      }
    }
  }
  RefCount<Token>::operator=(&(this->super_CharScanner)._returnToken,&local_58);
  RefCount<Token>::~RefCount(&local_58);
  return;
}

Assistant:

void GrpLexer::mOP_LE(bool _createToken) {
	int _ttype; RefToken _token; auto _begin=text.length();
	_ttype = OP_LE;
	
	match("<=");
	if ( _createToken && _token==nullToken && _ttype!=Token::SKIP ) {
	   _token = makeToken(_ttype);
	   _token->setText(text.substr(_begin, text.length()-_begin));
	}
	_returnToken = _token;
}